

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::internal::TracingMuxerImpl::ConsumerImpl::OnConnect(ConsumerImpl *this)

{
  ConsumerEndpoint *pCVar1;
  _Manager_type p_Var2;
  TracingSessionGlobalID session_id;
  TracingMuxerImpl *this_00;
  ScopedFile local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this->connected_ = true;
  pCVar1 = (this->service_)._M_t.
           super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
           .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
  (*pCVar1->_vptr_ConsumerEndpoint[0xc])(pCVar1,3);
  if ((this->trace_config_).
      super___shared_ptr<perfetto::protos::gen::TraceConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_6c.t_ = -1;
    SetupTracingSession(this->muxer_,this->session_id_,&this->trace_config_,&local_6c);
    base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::reset(&local_6c,-1);
  }
  if (this->start_pending_ == true) {
    StartTracingSession(this->muxer_,this->session_id_);
  }
  if (this->get_trace_stats_pending_ == true) {
    local_68 = 0;
    uStack_60 = 0;
    local_30 = (this->get_trace_stats_callback_)._M_invoker;
    local_38 = (this->get_trace_stats_callback_).super__Function_base._M_manager;
    if (local_38 == (_Manager_type)0x0) {
      this_00 = this->muxer_;
      session_id = this->session_id_;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_38 = (_Manager_type)0x0;
      p_Stack_50 = local_30;
    }
    else {
      local_68 = *(undefined8 *)&(this->get_trace_stats_callback_).super__Function_base._M_functor;
      uStack_60 = *(undefined8 *)
                   ((long)&(this->get_trace_stats_callback_).super__Function_base._M_functor + 8);
      (this->get_trace_stats_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->get_trace_stats_callback_)._M_invoker = (_Invoker_type)0x0;
      this_00 = this->muxer_;
      session_id = this->session_id_;
      local_48._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->get_trace_stats_callback_).super__Function_base._M_functor;
      local_48._8_8_ =
           *(undefined8 *)
            ((long)&(this->get_trace_stats_callback_).super__Function_base._M_functor + 8);
      p_Stack_50 = (_Invoker_type)0x0;
    }
    local_58 = (code *)0x0;
    GetTraceStats(this_00,session_id,(GetTraceStatsCallback *)&local_48);
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  p_Var2 = (this->query_service_state_callback_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_10 = (this->query_service_state_callback_)._M_invoker;
    local_68 = *(undefined8 *)&(this->query_service_state_callback_).super__Function_base._M_functor
    ;
    uStack_60 = *(undefined8 *)
                 ((long)&(this->query_service_state_callback_).super__Function_base._M_functor + 8);
    (this->query_service_state_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->query_service_state_callback_)._M_invoker = (_Invoker_type)0x0;
    local_28._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(this->query_service_state_callback_).super__Function_base._M_functor;
    local_28._8_8_ =
         *(undefined8 *)
          ((long)&(this->query_service_state_callback_).super__Function_base._M_functor + 8);
    local_58 = (code *)0x0;
    p_Stack_50 = (_Invoker_type)0x0;
    local_18 = p_Var2;
    QueryServiceState(this->muxer_,this->session_id_,(QueryServiceStateCallback *)&local_28);
    if (local_18 != (_Manager_type)0x0) {
      (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
    }
  }
  if (this->stop_pending_ == true) {
    StopTracingSession(this->muxer_,this->session_id_);
  }
  return;
}

Assistant:

void TracingMuxerImpl::ConsumerImpl::OnConnect() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(!connected_);
  connected_ = true;

  // Observe data source instance events so we get notified when tracing starts.
  service_->ObserveEvents(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES |
                          ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);

  // If the API client configured and started tracing before we connected,
  // tell the backend about it now.
  if (trace_config_)
    muxer_->SetupTracingSession(session_id_, trace_config_);
  if (start_pending_)
    muxer_->StartTracingSession(session_id_);
  if (get_trace_stats_pending_) {
    auto callback = std::move(get_trace_stats_callback_);
    get_trace_stats_callback_ = nullptr;
    muxer_->GetTraceStats(session_id_, std::move(callback));
  }
  if (query_service_state_callback_) {
    auto callback = std::move(query_service_state_callback_);
    query_service_state_callback_ = nullptr;
    muxer_->QueryServiceState(session_id_, std::move(callback));
  }
  if (stop_pending_)
    muxer_->StopTracingSession(session_id_);
}